

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DenseMap.h
# Opt level: O2

ExprBase ** __thiscall
SmallDenseMap<TypedFunctionInstanceRequest,_ExprBase_*,_TypedFunctionInstanceRequestHasher,_32U>::
find(SmallDenseMap<TypedFunctionInstanceRequest,_ExprBase_*,_TypedFunctionInstanceRequestHasher,_32U>
     *this,TypedFunctionInstanceRequest *key)

{
  uint uVar1;
  Node *pNVar2;
  TypeBase *pTVar3;
  SynBase *pSVar4;
  uint uVar5;
  uint uVar6;
  int iVar7;
  bool bVar8;
  
  uVar5 = this->bucketCount;
  uVar1 = uVar5 - 1;
  uVar6 = key->hash;
  pNVar2 = this->data;
  iVar7 = 0;
  while( true ) {
    bVar8 = uVar5 == 0;
    uVar5 = uVar5 - 1;
    if (bVar8) {
      return (ExprBase **)0x0;
    }
    uVar6 = uVar6 & uVar1;
    pTVar3 = pNVar2[uVar6].key.instanceType;
    pSVar4 = pNVar2[uVar6].key.syntax;
    if (pTVar3 == (TypeBase *)0x0 && pSVar4 == (SynBase *)0x0) break;
    if ((pTVar3 == key->instanceType) && (pSVar4 == key->syntax)) {
      return &pNVar2[uVar6].value;
    }
    uVar6 = uVar6 + iVar7 + 1;
    iVar7 = iVar7 + 1;
  }
  return (ExprBase **)0x0;
}

Assistant:

Value* find(const Key& key) const
	{
		unsigned bucketMask = bucketCount - 1;
		unsigned bucket = Hasher()(key) & bucketMask;

		for(unsigned i = 0; i < bucketCount; i++)
		{
			Node &item = data[bucket];

			if(item.key == Key())
				return NULL;

			if(item.key == key)
				return &item.value;

			// Quadratic probing
			bucket = (bucket + i + 1) & bucketMask;
		}

		return NULL;
	}